

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterBase.c
# Opt level: O3

ZyanStatus
ZydisFormatterBaseFormatOperandPTR
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  void **ppvVar1;
  ZyanUSize ZVar2;
  void *pvVar3;
  ZyanStatus ZVar4;
  ulong uVar5;
  ZyanU8 ZVar6;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                  ,0xa7,
                  "ZyanStatus ZydisFormatterBaseFormatOperandPTR(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                  ,0xa8,
                  "ZyanStatus ZydisFormatterBaseFormatOperandPTR(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                  ,0xa9,
                  "ZyanStatus ZydisFormatterBaseFormatOperandPTR(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if ((buffer->is_token_list != '\0') &&
     (ZVar4 = ZydisFormatterBufferAppend(buffer,'\v'), (int)ZVar4 < 0)) {
    return ZVar4;
  }
  if (formatter->addr_base == ZYDIS_NUMERIC_BASE_HEX) {
    ZVar4 = ZydisStringAppendHexU
                      (&buffer->string,(ulong)(context->operand->field_10).ptr.segment,'\x04',
                       formatter->hex_force_leading_number,formatter->hex_uppercase,
                       formatter->number_format[1][0].string,formatter->number_format[1][1].string);
LAB_001172e3:
    if ((int)ZVar4 < 0) {
      return ZVar4;
    }
    if (buffer->is_token_list == '\0') {
      if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) {
        __assert_fail("!destination->vector.allocator",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                      ,0xeb,
                      "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
      }
      ZVar2 = (buffer->string).vector.size;
      if (ZVar2 == 0) {
        __assert_fail("destination->vector.size && source->size",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                      ,0xec,
                      "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
      }
      if ((buffer->string).vector.capacity < ZVar2 + 1) {
        return 0x80100009;
      }
      *(undefined2 *)((long)(buffer->string).vector.data + (ZVar2 - 1)) = 0x3a;
      ZVar2 = (buffer->string).vector.size;
      pvVar3 = (buffer->string).vector.data;
      (buffer->string).vector.size = ZVar2 + 1;
      if (*(char *)((long)pvVar3 + ZVar2) != '\0') {
        __assert_fail("*(char*)((ZyanU8*)(destination)->vector.data + (destination)->vector.size - 1) == \'\\0\'"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                      ,0xf7,
                      "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
      }
    }
    else {
      ZVar2 = (buffer->string).vector.size;
      if (0xfe < ZVar2 - 1) {
        __assert_fail("(len > 0) && (len < 256)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/FormatterBase.h"
                      ,0xe7,
                      "ZyanStatus ZydisFormatterBufferAppendPredefined(ZydisFormatterBuffer *, const ZydisPredefinedToken *)"
                     );
      }
      if (buffer->capacity <= ZVar2 + 4) {
        return 0x80100009;
      }
      pvVar3 = (buffer->string).vector.data;
      *(char *)((long)pvVar3 + -1) = (char)ZVar2;
      *(undefined4 *)((long)pvVar3 + ZVar2) = 0x3a0002;
      uVar5 = buffer->capacity - (ZVar2 + 2);
      buffer->capacity = uVar5;
      ppvVar1 = &(buffer->string).vector.data;
      *ppvVar1 = (void *)((long)*ppvVar1 + ZVar2 + 2);
      (buffer->string).vector.size = 2;
      if (0xfe < uVar5) {
        uVar5 = 0xff;
      }
      (buffer->string).vector.capacity = uVar5;
    }
    ZVar6 = context->instruction->operand_width;
    if (ZVar6 == '\x10') {
      ZVar6 = '\x04';
    }
    else {
      if (ZVar6 != ' ') goto LAB_001173b4;
      ZVar6 = '\b';
    }
    if ((buffer->is_token_list != '\0') &&
       (ZVar4 = ZydisFormatterBufferAppend(buffer,'\v'), (int)ZVar4 < 0)) {
      return ZVar4;
    }
    if (formatter->addr_base == ZYDIS_NUMERIC_BASE_HEX) {
      ZVar4 = ZydisStringAppendHexU
                        (&buffer->string,(ulong)(context->operand->field_10).mem.segment,ZVar6,
                         formatter->hex_force_leading_number,formatter->hex_uppercase,
                         formatter->number_format[1][0].string,formatter->number_format[1][1].string
                        );
    }
    else {
      if (formatter->addr_base != ZYDIS_NUMERIC_BASE_DEC) {
        return 0x80100004;
      }
      ZVar4 = ZydisStringAppendDecU
                        (&buffer->string,(ulong)(context->operand->field_10).mem.segment,ZVar6,
                         formatter->number_format[0][0].string,formatter->number_format[0][1].string
                        );
    }
    if (-1 < (int)ZVar4) {
      ZVar4 = 0x100000;
    }
  }
  else {
    if (formatter->addr_base == ZYDIS_NUMERIC_BASE_DEC) {
      ZVar4 = ZydisStringAppendDecU
                        (&buffer->string,(ulong)(context->operand->field_10).ptr.segment,'\x04',
                         formatter->number_format[0][0].string,formatter->number_format[0][1].string
                        );
      goto LAB_001172e3;
    }
LAB_001173b4:
    ZVar4 = 0x80100004;
  }
  return ZVar4;
}

Assistant:

ZyanStatus ZydisFormatterBaseFormatOperandPTR(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_IMMEDIATE);
    ZYDIS_STRING_APPEND_NUM_U(formatter, formatter->addr_base, &buffer->string,
        context->operand->ptr.segment, 4, formatter->hex_force_leading_number);
    ZYDIS_BUFFER_APPEND(buffer, DELIM_SEGMENT);

    ZyanU8 padding;
    switch (context->instruction->operand_width)
    {
    case 16:
        padding = 4;
        break;
    case 32:
        padding = 8;
        break;
    default:
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_IMMEDIATE);
    ZYDIS_STRING_APPEND_NUM_U(formatter, formatter->addr_base, &buffer->string,
        context->operand->ptr.offset , padding, formatter->hex_force_leading_number);

    return ZYAN_STATUS_SUCCESS;
}